

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O3

void __thiscall Rml::BaseXMLParser::BaseXMLParser(BaseXMLParser *this)

{
  this->_vptr_BaseXMLParser = (_func_int **)&PTR__BaseXMLParser_0032e068;
  this->source_url = (URL *)0x0;
  (this->xml_source)._M_dataplus._M_p = (pointer)&(this->xml_source).field_2;
  (this->xml_source)._M_string_length = 0;
  (this->xml_source).field_2._M_local_buf[0] = '\0';
  this->inner_xml_data_terminate_depth = 0;
  this->xml_index = 0;
  this->line_number = 0;
  this->line_number_open_tag = 0;
  *(undefined8 *)((long)&this->line_number_open_tag + 1) = 0;
  this->inner_xml_data_index_begin = 0;
  (this->attributes).m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->attributes).m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->attributes).m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->data)._M_dataplus._M_p = (pointer)&(this->data).field_2;
  (this->data)._M_string_length = 0;
  (this->data).field_2._M_local_buf[0] = '\0';
  (this->cdata_tags).m_container.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cdata_tags).m_container.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cdata_tags).m_container.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->attributes_for_inner_xml_data).m_container.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->attributes_for_inner_xml_data).m_container.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->attributes_for_inner_xml_data).m_container.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

BaseXMLParser::BaseXMLParser() {}